

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Table * luaH_new(lua_State *L)

{
  Table *t_00;
  Table *t;
  GCObject *o;
  lua_State *L_local;
  
  t_00 = (Table *)luaC_newobj(L,5,0x38);
  t_00->metatable = (Table *)0x0;
  t_00->flags = '?';
  t_00->array = (TValue *)0x0;
  t_00->alimit = 0;
  setnodevector(L,t_00,0);
  return t_00;
}

Assistant:

Table *luaH_new (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_VTABLE, sizeof(Table));
  Table *t = gco2t(o);
  t->metatable = NULL;
  t->flags = cast_byte(maskflags);  /* table has no metamethod fields */
  t->array = NULL;
  t->alimit = 0;
  setnodevector(L, t, 0);
  return t;
}